

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int setup_traffic_protection
              (ptls_t *tls,int is_enc,char *secret_label,size_t epoch,uint64_t seq,int skip_notify)

{
  st_ptls_update_traffic_key_t *psVar1;
  st_ptls_aead_context_t *__ptr;
  int iVar2;
  ptls_aead_context_t *ppVar3;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *secret;
  ptls_iovec_t secret_00;
  
  secret = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)&(tls->traffic_protection).enc;
  if (is_enc == 0) {
    secret = &tls->traffic_protection;
  }
  if ((secret_label != (char *)0x0) &&
     (iVar2 = derive_secret(tls->key_schedule,secret,secret_label), iVar2 != 0)) {
    return iVar2;
  }
  (secret->dec).epoch = epoch;
  secret_00.len = (tls->key_schedule->hashes[0].algo)->digest_size;
  secret_00.base = (uint8_t *)secret;
  log_secret(tls,setup_traffic_protection::log_labels[((byte)tls->field_0x1e8 & 1) == is_enc][epoch]
             ,secret_00);
  psVar1 = tls->ctx->update_traffic_key;
  if (psVar1 == (st_ptls_update_traffic_key_t *)0x0) {
    __ptr = (secret->dec).aead;
    if (__ptr != (st_ptls_aead_context_t *)0x0) {
      (*__ptr->dispose_crypto)(__ptr);
      free(__ptr);
    }
    ppVar3 = ptls_aead_new(tls->cipher_suite->aead,tls->cipher_suite->hash,is_enc,secret,
                           tls->ctx->hkdf_label_prefix__obsolete);
    (secret->dec).aead = ppVar3;
    if (ppVar3 == (ptls_aead_context_t *)0x0) {
      iVar2 = 0x201;
    }
    else {
      (secret->dec).seq = seq;
      iVar2 = 0;
    }
  }
  else {
    iVar2 = 0;
    if (skip_notify == 0) {
      iVar2 = (*psVar1->cb)(psVar1,tls,is_enc,epoch,secret);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

static int setup_traffic_protection(ptls_t *tls, int is_enc, const char *secret_label, size_t epoch, uint64_t seq, int skip_notify)
{
    static const char *log_labels[2][4] = {
        {NULL, "CLIENT_EARLY_TRAFFIC_SECRET", "CLIENT_HANDSHAKE_TRAFFIC_SECRET", "CLIENT_TRAFFIC_SECRET_0"},
        {NULL, NULL, "SERVER_HANDSHAKE_TRAFFIC_SECRET", "SERVER_TRAFFIC_SECRET_0"}};
    struct st_ptls_traffic_protection_t *ctx = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;

    if (secret_label != NULL) {
        int ret;
        if ((ret = derive_secret(tls->key_schedule, ctx->secret, secret_label)) != 0)
            return ret;
    }

    ctx->epoch = epoch;

    log_secret(tls, log_labels[ptls_is_server(tls) == is_enc][epoch],
               ptls_iovec_init(ctx->secret, tls->key_schedule->hashes[0].algo->digest_size));

    /* special path for applications having their own record layer */
    if (tls->ctx->update_traffic_key != NULL) {
        if (skip_notify)
            return 0;
        return tls->ctx->update_traffic_key->cb(tls->ctx->update_traffic_key, tls, is_enc, epoch, ctx->secret);
    }

    if (ctx->aead != NULL)
        ptls_aead_free(ctx->aead);
    if ((ctx->aead = ptls_aead_new(tls->cipher_suite->aead, tls->cipher_suite->hash, is_enc, ctx->secret,
                                   tls->ctx->hkdf_label_prefix__obsolete)) == NULL)
        return PTLS_ERROR_NO_MEMORY; /* TODO obtain error from ptls_aead_new */
    ctx->seq = seq;

#if defined(PTLS_DEBUG) && PTLS_DEBUG
    {
        uint8_t static_iv[PTLS_MAX_IV_SIZE];
        ptls_aead_get_iv(ctx->aead, static_iv);
        PTLS_DEBUGF("[%s] %02x%02x,%02x%02x\n", log_labels[ptls_is_server(tls)][epoch], (unsigned)ctx->secret[0],
                    (unsigned)ctx->secret[1], static_iv[0], static_iv[1]);
    }
#endif

    return 0;
}